

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  int iVar1;
  uint32_t uVar2;
  Variant *pVVar3;
  SPIRVariable *pSVar4;
  SPIRExtension *pSVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  uVar7 = 0;
  uVar8 = uVar7;
  if (0xa8 < (int)opcode) {
    uVar8 = 0;
    switch(opcode) {
    case OpAtomicLoad:
    case OpAtomicExchange:
    case OpAtomicCompareExchange:
    case OpAtomicCompareExchangeWeak:
    case OpAtomicIIncrement:
    case OpAtomicIDecrement:
    case OpAtomicIAdd:
    case OpAtomicISub:
    case OpAtomicSMin:
    case OpAtomicUMin:
    case OpAtomicSMax:
    case OpAtomicUMax:
    case OpAtomicAnd:
    case OpAtomicOr:
    case OpAtomicXor:
      goto switchD_007bf644_caseD_e3;
    case OpAtomicStore:
      goto switchD_007bf644_caseD_e4;
    case OpAtomicXor|OpUndef:
    case OpAtomicAnd|OpSourceExtension:
      break;
    case OpPhi:
      if (length < 2) {
        return false;
      }
      uVar8 = 0;
      if (length - 2 != 0) {
        uVar9 = 0;
        do {
          uVar6 = (ulong)args[uVar9 + 2];
          if ((uVar6 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
             pVVar3[uVar6].type == TypeVariable)) {
            pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar6);
          }
          else {
            pSVar4 = (SPIRVariable *)0x0;
          }
          if (((pSVar4 != (SPIRVariable *)0x0) && (pSVar4->storage < (StorageBuffer|Input))) &&
             ((0x160fU >> (pSVar4->storage & 0x1f) & 1) != 0)) {
            local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)this->variables;
            local_3c = args[uVar9 + 2];
            ::std::
            _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                      (local_38,&local_3c,&local_38);
          }
          uVar9 = uVar9 + 2;
          uVar8 = 0;
        } while (uVar9 < length - 2);
      }
      break;
    default:
      uVar8 = uVar7;
      if (opcode == OpSelect) {
        if (length < 5) {
          return false;
        }
        uVar8 = 0;
        if (length - 3 != 0) {
          uVar9 = 0;
          do {
            uVar6 = (ulong)args[uVar9 + 3];
            if ((uVar6 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                         buffer_size) &&
               (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                         ptr, pVVar3[uVar6].type == TypeVariable)) {
              pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar6);
            }
            else {
              pSVar4 = (SPIRVariable *)0x0;
            }
            if (((pSVar4 != (SPIRVariable *)0x0) && (pSVar4->storage < (StorageBuffer|Input))) &&
               ((0x160fU >> (pSVar4->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar9 + 3];
              ::std::
              _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
            uVar9 = uVar9 + 1;
            uVar8 = 0;
          } while (length - 3 != uVar9);
        }
      }
    }
    goto switchD_007bf644_caseD_f3;
  }
  switch(opcode) {
  case OpFunctionCall:
    if (length < 3) {
      return false;
    }
    uVar8 = 0;
    if (length - 3 != 0) {
      uVar9 = 0;
      do {
        uVar6 = (ulong)args[uVar9 + 3];
        if ((uVar6 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                     buffer_size) &&
           (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
           pVVar3[uVar6].type == TypeVariable)) {
          pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar6);
        }
        else {
          pSVar4 = (SPIRVariable *)0x0;
        }
        if (((pSVar4 != (SPIRVariable *)0x0) && (pSVar4->storage < (StorageBuffer|Input))) &&
           ((0x160fU >> (pSVar4->storage & 0x1f) & 1) != 0)) {
          local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)this->variables;
          local_3c = args[uVar9 + 3];
          ::std::
          _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                    (local_38,&local_3c,&local_38);
        }
        uVar9 = uVar9 + 1;
        uVar8 = 0;
      } while (length - 3 != uVar9);
    }
    break;
  case OpFunctionEnd|OpSourceContinued:
  case OpVariable:
  case OpCopyMemorySized:
    break;
  case OpStore:
switchD_007bf644_caseD_e4:
    if (length == 0) {
      return false;
    }
    uVar8 = *args;
    break;
  case OpCopyMemory:
    if (length < 2) {
      return false;
    }
    uVar9 = (ulong)*args;
    if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                 buffer_size) &&
       (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar3[uVar9].type == TypeVariable)) {
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar9);
    }
    else {
      pSVar4 = (SPIRVariable *)0x0;
    }
    if (((pSVar4 != (SPIRVariable *)0x0) && (pSVar4->storage < (StorageBuffer|Input))) &&
       ((0x160fU >> (pSVar4->storage & 0x1f) & 1) != 0)) {
      local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this->variables;
      local_3c = *args;
      ::std::
      _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                ();
    }
    uVar9 = (ulong)args[1];
    uVar8 = 0;
    if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                 buffer_size) &&
       (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar3[uVar9].type == TypeVariable)) {
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar9);
    }
    else {
      pSVar4 = (SPIRVariable *)0x0;
    }
    if (((pSVar4 == (SPIRVariable *)0x0) || (StorageBuffer < pSVar4->storage)) ||
       ((0x160fU >> (pSVar4->storage & 0x1f) & 1) == 0)) break;
    local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this->variables;
    local_3c = args[1];
LAB_007bfac1:
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
              ();
    uVar8 = 0;
    break;
  default:
    if (opcode == OpExtInst) {
      uVar8 = 0;
      if (length < 3) {
        return false;
      }
      pSVar5 = Variant::get<diligent_spirv_cross::SPIRExtension>
                         ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                          ptr + args[2]);
      iVar1 = *(int *)&(pSVar5->super_IVariant).field_0xc;
      if (iVar1 == 4) {
        if (args[3] != 1) break;
      }
      else {
        if (iVar1 != 1) break;
        uVar2 = args[3];
        if (2 < uVar2 - 0x4c) {
          if ((uVar2 != 10) && (uVar2 != 0x23)) break;
          uVar9 = (ulong)args[5];
          uVar8 = 0;
          if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
             pVVar3[uVar9].type == TypeVariable)) {
            pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar9);
          }
          else {
            pSVar4 = (SPIRVariable *)0x0;
          }
          if (((pSVar4 == (SPIRVariable *)0x0) || (StorageBuffer < pSVar4->storage)) ||
             ((0x160fU >> (pSVar4->storage & 0x1f) & 1) == 0)) break;
          local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)this->variables;
          local_3c = args[5];
          goto LAB_007bfac1;
        }
      }
      uVar9 = (ulong)args[4];
      uVar8 = 0;
      if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                   buffer_size) &&
         (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar3[uVar9].type == TypeVariable)) {
        pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar9);
      }
      else {
        pSVar4 = (SPIRVariable *)0x0;
      }
      if (((pSVar4 == (SPIRVariable *)0x0) || (StorageBuffer < pSVar4->storage)) ||
         ((0x160fU >> (pSVar4->storage & 0x1f) & 1) == 0)) break;
      local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this->variables;
      local_3c = args[4];
      goto LAB_007bfac1;
    }
    if (opcode != OpCopyObject) break;
  case OpImageTexelPointer:
  case OpLoad:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
switchD_007bf644_caseD_e3:
    if (length < 3) {
      return false;
    }
    uVar8 = args[2];
  }
switchD_007bf644_caseD_f3:
  if (uVar8 != 0) {
    uVar9 = (ulong)uVar8;
    if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                 buffer_size) &&
       (pVVar3 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar3[uVar9].type == TypeVariable)) {
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + uVar9);
    }
    else {
      pSVar4 = (SPIRVariable *)0x0;
    }
    if (((pSVar4 != (SPIRVariable *)0x0) && (pSVar4->storage < (StorageBuffer|Input))) &&
       ((0x160fU >> (pSVar4->storage & 0x1f) & 1) != 0)) {
      local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this->variables;
      local_3c = uVar8;
      ::std::
      _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                ();
    }
  }
  return true;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 3)
			return false;
		auto &extension_set = compiler.get<SPIRExtension>(args[2]);
		switch (extension_set.ext)
		{
		case SPIRExtension::GLSL:
		{
			auto op = static_cast<GLSLstd450>(args[3]);

			switch (op)
			{
			case GLSLstd450InterpolateAtCentroid:
			case GLSLstd450InterpolateAtSample:
			case GLSLstd450InterpolateAtOffset:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			case GLSLstd450Modf:
			case GLSLstd450Fract:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[5]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[5]);
				break;
			}

			default:
				break;
			}
			break;
		}
		case SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter:
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
			break;
		}
		default:
			break;
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}